

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

void Fx_ManFindCommonPairs
               (Vec_Wec_t *vCubes,Vec_Int_t *vPart0,Vec_Int_t *vPart1,Vec_Int_t *vPairs,
               Vec_Int_t *vCompls,Vec_Int_t *vDiv,Vec_Int_t *vCubeFree,int *fWarning)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *vArr1;
  Vec_Int_t *vArr2;
  bool local_81;
  int CubeId2;
  int CubeId1;
  int fCompl;
  int k_;
  int i_;
  int k;
  int i;
  int *pEnd2;
  int *pEnd1;
  int *pBeg2;
  int *pBeg1;
  Vec_Int_t *vDiv_local;
  Vec_Int_t *vCompls_local;
  Vec_Int_t *vPairs_local;
  Vec_Int_t *vPart1_local;
  Vec_Int_t *vPart0_local;
  Vec_Wec_t *vCubes_local;
  
  pBeg2 = vPart0->pArray;
  pEnd1 = vPart1->pArray;
  piVar3 = vPart0->pArray;
  iVar1 = vPart0->nSize;
  piVar4 = vPart1->pArray;
  iVar2 = vPart1->nSize;
  Vec_IntClear(vPairs);
  Vec_IntClear(vCompls);
  while (pBeg2 < piVar3 + iVar1 && pEnd1 < piVar4 + iVar2) {
    iVar5 = Fx_ManGetCubeVar(vCubes,*pBeg2);
    iVar6 = Fx_ManGetCubeVar(vCubes,*pEnd1);
    if (iVar5 == iVar6) {
      i_ = 1;
      while ((pBeg2 + i_ < piVar3 + iVar1 &&
             (iVar6 = Fx_ManGetCubeVar(vCubes,pBeg2[i_]), iVar5 == iVar6))) {
        i_ = i_ + 1;
      }
      k_ = 1;
      while ((pEnd1 + k_ < piVar4 + iVar2 &&
             (iVar6 = Fx_ManGetCubeVar(vCubes,pEnd1[k_]), iVar5 == iVar6))) {
        k_ = k_ + 1;
      }
      for (fCompl = 0; fCompl < i_; fCompl = fCompl + 1) {
        for (CubeId1 = 0; CubeId1 < k_; CubeId1 = CubeId1 + 1) {
          if (pBeg2[fCompl] != pEnd1[CubeId1]) {
            vArr1 = Vec_WecEntry(vCubes,pBeg2[fCompl]);
            vArr2 = Vec_WecEntry(vCubes,pEnd1[CubeId1]);
            Fx_ManDivFindCubeFree(vArr1,vArr2,vCubeFree,fWarning);
            iVar5 = Vec_IntSize(vCubeFree);
            local_81 = false;
            if (iVar5 == 4) {
              iVar5 = Fx_ManDivNormalize(vCubeFree);
              local_81 = iVar5 == 1;
            }
            iVar5 = Vec_IntEqual(vDiv,vCubeFree);
            if (iVar5 != 0) {
              Vec_IntPush(vPairs,pBeg2[fCompl]);
              Vec_IntPush(vPairs,pEnd1[CubeId1]);
              Vec_IntPush(vCompls,(uint)local_81);
            }
          }
        }
      }
      pBeg2 = pBeg2 + i_;
      pEnd1 = pEnd1 + k_;
    }
    else if (iVar5 < iVar6) {
      pBeg2 = pBeg2 + 1;
    }
    else {
      pEnd1 = pEnd1 + 1;
    }
  }
  return;
}

Assistant:

void Fx_ManFindCommonPairs( Vec_Wec_t * vCubes, Vec_Int_t * vPart0, Vec_Int_t * vPart1, Vec_Int_t * vPairs, Vec_Int_t * vCompls, Vec_Int_t * vDiv, Vec_Int_t * vCubeFree, int * fWarning )
{
    int * pBeg1 = vPart0->pArray;
    int * pBeg2 = vPart1->pArray;
    int * pEnd1 = vPart0->pArray + vPart0->nSize;
    int * pEnd2 = vPart1->pArray + vPart1->nSize;
    int i, k, i_, k_, fCompl, CubeId1, CubeId2;
    Vec_IntClear( vPairs );
    Vec_IntClear( vCompls );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        CubeId1 = Fx_ManGetCubeVar(vCubes, *pBeg1);
        CubeId2 = Fx_ManGetCubeVar(vCubes, *pBeg2);
        if ( CubeId1 == CubeId2 )
        {
            for ( i = 1; pBeg1+i < pEnd1; i++ )
                if ( CubeId1 != Fx_ManGetCubeVar(vCubes, pBeg1[i]) )
                    break;
            for ( k = 1; pBeg2+k < pEnd2; k++ )
                if ( CubeId1 != Fx_ManGetCubeVar(vCubes, pBeg2[k]) )
                    break;
            for ( i_ = 0; i_ < i; i_++ )
            for ( k_ = 0; k_ < k; k_++ )
            {
                if ( pBeg1[i_] == pBeg2[k_] )
                    continue;
                Fx_ManDivFindCubeFree( Vec_WecEntry(vCubes, pBeg1[i_]), Vec_WecEntry(vCubes, pBeg2[k_]), vCubeFree, fWarning );
                fCompl = (Vec_IntSize(vCubeFree) == 4 && Fx_ManDivNormalize(vCubeFree) == 1);
                if ( !Vec_IntEqual( vDiv, vCubeFree ) )
                    continue;
                Vec_IntPush( vPairs, pBeg1[i_] );
                Vec_IntPush( vPairs, pBeg2[k_] );
                Vec_IntPush( vCompls, fCompl );
            }
            pBeg1 += i;
            pBeg2 += k;
        }
        else if ( CubeId1 < CubeId2 )
            pBeg1++;
        else 
            pBeg2++;
    }
}